

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<asl::WebSocket_*> * __thiscall
asl::Array<asl::WebSocket_*>::insert(Array<asl::WebSocket_*> *this,int k,WebSocket **x)

{
  bad_alloc *pbVar1;
  Data *pDVar2;
  WebSocket **extraout_RDX;
  WebSocket **extraout_RDX_00;
  WebSocket **x_00;
  WebSocket **extraout_RDX_01;
  int local_64;
  AtomicCount local_4c;
  WebSocket **local_48;
  WebSocket **b;
  char *p;
  int s1;
  int rc;
  int s;
  int n;
  Data *h;
  WebSocket **x_local;
  Array<asl::WebSocket_*> *pAStack_10;
  int k_local;
  Array<asl::WebSocket_*> *this_local;
  
  h = (Data *)x;
  x_local._4_4_ = k;
  pAStack_10 = this;
  _s = d(this);
  rc = _s->n;
  s1 = _s->s;
  if (x_local._4_4_ < 0) {
    x_local._4_4_ = rc;
  }
  x_00 = extraout_RDX;
  if (s1 <= rc) {
    s1 = s1 + 1;
    if (rc == 0x7fffffff) {
      pbVar1 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(pbVar1);
      __cxa_throw(pbVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    dup(this,k);
    pDVar2 = d(this);
    p._4_4_ = AtomicCount::operator_cast_to_int(&pDVar2->rc);
    if (s1 < 0x3fffffff) {
      local_64 = s1 << 1;
    }
    else {
      local_64 = 0x7fffffff;
    }
    p._0_4_ = local_64;
    b = (WebSocket **)realloc(this->_a + -2,(long)local_64 * 8 + 0x10);
    if (b == (WebSocket **)0x0) {
      pbVar1 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(pbVar1);
      __cxa_throw(pbVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_48 = b + 2;
    this->_a = local_48;
    _s = d(this);
    _s->s = (int)p;
    AtomicCount::AtomicCount(&local_4c,p._4_4_);
    (_s->rc).n = local_4c.n;
    x_00 = extraout_RDX_00;
  }
  if (x_local._4_4_ < rc) {
    memmove(this->_a + (long)x_local._4_4_ + 1,this->_a + x_local._4_4_,
            (long)(rc - x_local._4_4_) << 3);
    x_00 = extraout_RDX_01;
  }
  asl_construct_copy<asl::WebSocket*>((asl *)(this->_a + x_local._4_4_),(WebSocket **)h,x_00);
  _s->n = rc + 1;
  return this;
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}